

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cookie.c
# Opt level: O1

int replace_existing(Curl_easy *data,Cookie *co,CookieInfo *ci,_Bool secure,_Bool *replacep)

{
  char *pcVar1;
  char *second;
  curl_trc_feat *pcVar2;
  bool bVar3;
  int iVar4;
  size_t sVar5;
  Curl_llist_node *n;
  void *pvVar6;
  char *pcVar7;
  Cookie *co_00;
  Curl_llist_node *n_00;
  bool bVar8;
  bool bVar9;
  int local_54;
  
  sVar5 = cookiehash(co->domain);
  n = Curl_llist_head(ci->cookielist + sVar5);
  bVar3 = false;
  if (n == (Curl_llist_node *)0x0) {
    n_00 = (Curl_llist_node *)0x0;
  }
  else {
    bVar3 = false;
    n_00 = (Curl_llist_node *)0x0;
    do {
      pvVar6 = Curl_node_elem(n);
      iVar4 = curl_strequal(*(char **)((long)pvVar6 + 0x40),co->name);
      if (iVar4 == 0) {
LAB_0011f3a9:
        bVar8 = true;
        if (n_00 == (Curl_llist_node *)0x0) {
          iVar4 = curl_strequal(*(char **)((long)pvVar6 + 0x40),co->name);
          if (iVar4 != 0) {
            pcVar1 = *(char **)((long)pvVar6 + 0x60);
            if (pcVar1 == (char *)0x0) {
LAB_0011f40d:
              bVar9 = co->domain == (char *)0x0;
LAB_0011f417:
              if (bVar9) {
                bVar3 = true;
              }
            }
            else if (co->domain == (char *)0x0) {
              if (pcVar1 == (char *)0x0) goto LAB_0011f40d;
            }
            else {
              iVar4 = curl_strequal(pcVar1,co->domain);
              if (iVar4 != 0) {
                bVar9 = ((co->field_0x74 ^ *(byte *)((long)pvVar6 + 0x74)) & 1) == 0;
                goto LAB_0011f417;
              }
            }
            if (bVar3) {
              if (((*(char **)((long)pvVar6 + 0x58) == (char *)0x0) || (co->spath == (char *)0x0))
                 || (iVar4 = curl_strequal(*(char **)((long)pvVar6 + 0x58),co->spath), iVar4 != 0))
              {
                if ((co->spath != (char *)0x0) == (*(long *)((long)pvVar6 + 0x58) == 0)) {
                  bVar3 = false;
                }
              }
              else {
                bVar3 = false;
              }
            }
            if (bVar3) {
              n_00 = n;
              if (((co->field_0x74 & 4) == 0) && ((*(byte *)((long)pvVar6 + 0x74) & 4) != 0)) {
                local_54 = 0xf;
                bVar8 = false;
                n_00 = (Curl_llist_node *)0x0;
              }
              goto LAB_0011f48c;
            }
          }
          n_00 = (Curl_llist_node *)0x0;
        }
      }
      else {
        pcVar1 = *(char **)((long)pvVar6 + 0x60);
        if (pcVar1 == (char *)0x0) {
LAB_0011f2a6:
          bVar8 = co->domain == (char *)0x0;
LAB_0011f2b3:
          bVar9 = true;
          if ((((bVar8) && (pcVar1 = *(char **)((long)pvVar6 + 0x58), pcVar1 != (char *)0x0)) &&
              (second = co->spath, second != (char *)0x0)) &&
             (((*(byte *)((long)pvVar6 + 0x74) & 2) != 0 && ((co->field_0x74 & 2) == 0 && !secure)))
             ) {
            pcVar7 = strchr(pcVar1 + 1,0x2f);
            if (pcVar7 == (char *)0x0) {
              sVar5 = strlen(pcVar1);
            }
            else {
              sVar5 = (long)pcVar7 - (long)pcVar1;
            }
            iVar4 = curl_strnequal(pcVar1,second,sVar5);
            bVar9 = iVar4 == 0;
            if (!bVar9) {
              local_54 = 8;
            }
            if (((data != (Curl_easy *)0x0 && !bVar9) &&
                (local_54 = 8, ((data->set).field_0x8cd & 0x10) != 0)) &&
               ((pcVar2 = (data->state).feat, pcVar2 == (curl_trc_feat *)0x0 ||
                (0 < pcVar2->log_level)))) {
              Curl_infof(data,
                         "cookie \'%s\' for domain \'%s\' dropped, would overlay an existing cookie"
                         ,co->name,co->domain);
            }
          }
        }
        else {
          if (co->domain != (char *)0x0) {
            iVar4 = curl_strequal(pcVar1,co->domain);
            bVar8 = iVar4 != 0;
            goto LAB_0011f2b3;
          }
          bVar9 = true;
          if (pcVar1 == (char *)0x0) goto LAB_0011f2a6;
        }
        if (bVar9) goto LAB_0011f3a9;
        bVar8 = false;
      }
LAB_0011f48c:
      if (!bVar8) {
        return local_54;
      }
      n = Curl_node_next(n);
    } while (n != (Curl_llist_node *)0x0);
  }
  if (n_00 != (Curl_llist_node *)0x0) {
    co_00 = (Cookie *)Curl_node_elem(n_00);
    co->creationtime = co_00->creationtime;
    Curl_node_remove(n_00);
    freecookie(co_00);
  }
  *replacep = bVar3;
  return 0;
}

Assistant:

static int
replace_existing(struct Curl_easy *data,
                 struct Cookie *co,
                 struct CookieInfo *ci,
                 bool secure,
                 bool *replacep)
{
  bool replace_old = FALSE;
  struct Curl_llist_node *replace_n = NULL;
  struct Curl_llist_node *n;
  size_t myhash = cookiehash(co->domain);
  for(n = Curl_llist_head(&ci->cookielist[myhash]); n; n = Curl_node_next(n)) {
    struct Cookie *clist = Curl_node_elem(n);
    if(strcasecompare(clist->name, co->name)) {
      /* the names are identical */
      bool matching_domains = FALSE;

      if(clist->domain && co->domain) {
        if(strcasecompare(clist->domain, co->domain))
          /* The domains are identical */
          matching_domains = TRUE;
      }
      else if(!clist->domain && !co->domain)
        matching_domains = TRUE;

      if(matching_domains && /* the domains were identical */
         clist->spath && co->spath && /* both have paths */
         clist->secure && !co->secure && !secure) {
        size_t cllen;
        const char *sep;

        /*
         * A non-secure cookie may not overlay an existing secure cookie.
         * For an existing cookie "a" with path "/login", refuse a new
         * cookie "a" with for example path "/login/en", while the path
         * "/loginhelper" is ok.
         */

        sep = strchr(clist->spath + 1, '/');

        if(sep)
          cllen = sep - clist->spath;
        else
          cllen = strlen(clist->spath);

        if(strncasecompare(clist->spath, co->spath, cllen)) {
          infof(data, "cookie '%s' for domain '%s' dropped, would "
                "overlay an existing cookie", co->name, co->domain);
          return CERR_BAD_SECURE;
        }
      }
    }

    if(!replace_n && strcasecompare(clist->name, co->name)) {
      /* the names are identical */

      if(clist->domain && co->domain) {
        if(strcasecompare(clist->domain, co->domain) &&
          (clist->tailmatch == co->tailmatch))
          /* The domains are identical */
          replace_old = TRUE;
      }
      else if(!clist->domain && !co->domain)
        replace_old = TRUE;

      if(replace_old) {
        /* the domains were identical */

        if(clist->spath && co->spath &&
           !strcasecompare(clist->spath, co->spath))
          replace_old = FALSE;
        else if(!clist->spath != !co->spath)
          replace_old = FALSE;
      }

      if(replace_old && !co->livecookie && clist->livecookie) {
        /*
         * Both cookies matched fine, except that the already present cookie
         * is "live", which means it was set from a header, while the new one
         * was read from a file and thus is not "live". "live" cookies are
         * preferred so the new cookie is freed.
         */
        return CERR_LIVE_WINS;
      }
      if(replace_old)
        replace_n = n;
    }
  }
  if(replace_n) {
    struct Cookie *repl = Curl_node_elem(replace_n);

    /* when replacing, creationtime is kept from old */
    co->creationtime = repl->creationtime;

    /* unlink the old */
    Curl_node_remove(replace_n);

    /* free the old cookie */
    freecookie(repl);
  }
  *replacep = replace_old;
  return CERR_OK;
}